

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::utf8_to_json_string(utf8 *this,string *src)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint i;
  string *this_00;
  pointer pbVar5;
  ulong uVar6;
  byte *pbVar7;
  json_utf8_exception *this_01;
  type pbVar8;
  char32_t local_3c;
  uint l;
  char32_t uc;
  size_t src_index;
  undefined1 local_19;
  string *local_18;
  string *src_local;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  
  local_19 = 0;
  local_18 = src;
  src_local = (string *)this;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)this,
             (pointer)this_00);
  pbVar5 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)pbVar5);
  _l = 0;
  while (uVar1 = _l, uVar6 = std::__cxx11::string::size(), uVar1 < uVar6) {
    _l = _l + 1;
    pbVar7 = (byte *)std::__cxx11::string::operator[]((ulong)local_18);
    local_3c = (char32_t)*pbVar7;
    i = utf8_length(*pbVar7);
    switch(i) {
    case 1:
      break;
    case 2:
      cVar4 = next_char(local_18,(size_t *)&l);
      local_3c = (local_3c & 0x1fU) << 6 | (int)cVar4 & 0x3fU;
      break;
    case 3:
      bVar2 = next_char(local_18,(size_t *)&l);
      cVar4 = next_char(local_18,(size_t *)&l);
      local_3c = (int)cVar4 & 0x3fU | (local_3c & 0xfU) << 0xc | (bVar2 & 0x3f) << 6;
      break;
    case 4:
      bVar2 = next_char(local_18,(size_t *)&l);
      bVar3 = next_char(local_18,(size_t *)&l);
      cVar4 = next_char(local_18,(size_t *)&l);
      local_3c = (int)cVar4 & 0x3fU |
                 (local_3c & 7U) << 0x12 | (bVar2 & 0x3f) << 0xc | (bVar3 & 0x3f) << 6;
      break;
    default:
      this_01 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this_01,invalid_utf8_sequence_length_e,i);
      __cxa_throw(this_01,&json_utf8_exception::typeinfo,json_utf8_exception::~json_utf8_exception);
    }
    if ((uint)local_3c < 0x100) {
      if (local_3c == L'\b') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\b");
      }
      else if (local_3c == L'\t') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\t");
      }
      else if (local_3c == L'\n') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\n");
      }
      else if (local_3c == L'\f') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\f");
      }
      else if (local_3c == L'\r') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\r");
      }
      else if (local_3c == L'\"') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\\"");
      }
      else if (local_3c == L'\\') {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,"\\\\");
      }
      else {
        pbVar8 = std::
                 unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
        std::__cxx11::string::operator+=((string *)pbVar8,(char)local_3c);
      }
    }
    else if ((uint)local_3c < 0x10000) {
      add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,local_3c);
    }
    else {
      add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,((uint)(local_3c + L'\xffff0000') >> 10) + L'\xd800');
      add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,local_3c + L'\xffff0000' & 0x3ffU | 0xdc00);
    }
  }
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<string> utf8::utf8_to_json_string(const string &src)
{
    unique_ptr<string> res(new string);

    // We need at least the same number of characters as the source.
    res->reserve(src.size());

    size_t src_index = 0;

    while (src_index < src.size())
    {
        char32_t uc = src[src_index++] & 0xff;

        unsigned int l = utf8_length(uc);

        switch (l)
        {
        case 1:
            break;
        case 2:
            uc = ((uc << 6) & 0x7ff) | (next_char(src, src_index) & 0x3f);
            break;
        case 3:
            uc = ((uc << 12) & 0xffff) | ((next_char(src, src_index) << 6) & 0xfff);
            uc |= next_char(src, src_index) & 0x3f;
            break;
        case 4:
            uc = ((uc << 18) & 0x1fffff) | ((next_char(src, src_index) << 12) & 0x3ffff);
            uc |= (next_char(src, src_index) << 6) & 0xfff;
            uc |= next_char(src, src_index) & 0x3f;  
            break;
        default:
            throw json_utf8_exception(json_utf8_exception::invalid_utf8_sequence_length_e, l);
        }

        if (uc <= 0xff)
        {
            switch (uc)
            {
            case '"':
                *res += "\\\"";
                break;
            case '\\':
                *res += "\\\\";
                break;
            case '\b':
                *res += "\\b";
                break;
            case '\f':
                *res += "\\f";
                break;
            case '\n':
                *res += "\\n";
                break;
            case '\r':
                *res += "\\r";
                break;
            case '\t':
                *res += "\\t";
                break;
            default: 
                *res += static_cast<char>(uc);
            }
        }
        else if (uc <= 0xffff)
        {
            add_hex_string(res, uc);
        }
        else
        {
            uc -= 0x10000;
            add_hex_string(res, (uc >> 10) + 0xD800);
            add_hex_string(res, (uc & 0x3ff) + 0xDC00);
        }
    }

    return res;
}